

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioreg_util.h
# Opt level: O2

_Bool is_ioreg_writable(uint32_t address)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = address & 0xff00ffff;
  if ((address & 0xff00ffff) != 0x4000800) {
    uVar1 = address;
  }
  if (0x4000803 < uVar1) {
    return false;
  }
  uVar2 = 0x800;
  if ((uVar1 & 0x700ffff) != 0x4000800) {
    uVar2 = (ulong)(uVar1 + 0xfc000000);
  }
  return (io_register_access[uVar2] & ~R) == W;
}

Assistant:

bool is_ioreg_writable(word address) {
    word mirrored = mirror_ioreg(address);
    if (mirrored >= 0x4000804) {
        return false;
    }
    else {
        ioreg_access_t access = io_register_access[ioreg_index(mirrored)];
        return access == W || access == RW;
    }
}